

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

bool anon_unknown.dwarf_1a40549::IsValidFeatureFormat(string *format)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = std::__cxx11::string::find((char *)format,0x850278,0);
  bVar2 = true;
  if (lVar1 == -1) {
    lVar1 = std::__cxx11::string::find((char *)format,0x850daf,0);
    if (lVar1 == -1) {
      lVar1 = std::__cxx11::string::find((char *)format,0x850dba,0);
      bVar2 = lVar1 != -1;
    }
  }
  return bVar2;
}

Assistant:

bool IsValidFeatureFormat(const std::string& format)
{
  return format.find("<LIBRARY>") != std::string::npos ||
    format.find("<LIB_ITEM>") != std::string::npos ||
    format.find("<LINK_ITEM>") != std::string::npos;
}